

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O1

vector<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_> * __thiscall
apngasm::APNGAsm::fileToFrames(APNGAsm *this,string *filePath,uint delayNum,uint delayDen)

{
  pointer *ppAVar1;
  pointer *ppCVar2;
  byte bVar3;
  byte bVar4;
  uchar bop;
  ushort uVar5;
  ushort uVar6;
  pointer pAVar7;
  pointer pAVar8;
  uchar *puVar9;
  iterator __position;
  iterator iVar10;
  uint uVar11;
  bool bVar12;
  bool bVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  uint uVar18;
  APNGAsm *__stream;
  size_t sVar19;
  pointer pCVar20;
  uchar uVar21;
  uint uVar22;
  ulong uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  pointer pCVar27;
  ulong uVar28;
  int iVar29;
  ulong uVar30;
  ulong uVar31;
  APNGAsm *pAVar32;
  uint uVar33;
  bool bVar34;
  uint uVar35;
  uint local_d44;
  uint local_d40;
  ulong local_d38;
  CHUNK chunk;
  uint local_d00;
  uint local_cfc;
  uchar sig [8];
  APNGFrame frameCur;
  APNGFrame frameNext;
  APNGFrame frameRaw;
  
  pAVar7 = (this->_frames).
           super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pAVar8 = (this->_frames).
           super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>._M_impl.
           super__Vector_impl_data._M_start;
  __stream = (APNGAsm *)fopen((filePath->_M_dataplus)._M_p,"rb");
  if (__stream != (APNGAsm *)0x0) {
    sVar19 = fread(sig,1,8,(FILE *)__stream);
    if (sVar19 == 8) {
      bVar34 = false;
      pAVar32 = (APNGAsm *)sig;
      iVar14 = png_sig_cmp(pAVar32,0,8);
      if (iVar14 == 0) {
        uVar15 = read_chunk(pAVar32,(FILE *)__stream,&this->_chunkIHDR);
        bVar34 = false;
        if ((uVar15 == 0x52444849) && ((this->_chunkIHDR).size == 0x19)) {
          puVar9 = (this->_chunkIHDR).p;
          iVar14 = (uint)puVar9[8] * 0x1000000;
          iVar29 = (uint)puVar9[9] * 0x10000;
          bVar3 = puVar9[10];
          uVar26 = (uint)bVar3 * 0x100;
          bVar4 = puVar9[0xb];
          uVar22 = iVar14 + iVar29 | uVar26 | (uint)bVar4;
          uVar11 = (uint)puVar9[0xc] * 0x1000000;
          uVar15 = (uint)puVar9[0xd] * 0x10000;
          uVar24 = (uint)puVar9[0xe] * 0x100;
          uVar16 = (uint)puVar9[0xf];
          uVar33 = uVar15 + uVar11 | uVar24 | uVar16;
          local_d38 = (ulong)uVar33;
          uVar23 = (ulong)(uVar22 * uVar33 * 4);
          APNGFrame::APNGFrame(&frameRaw);
          APNGFrame::APNGFrame(&frameCur);
          APNGFrame::APNGFrame(&frameNext);
          frameRaw._pixels = (uchar *)operator_new__(uVar23);
          uVar28 = local_d38 << 6;
          frameRaw._rows = (uchar **)operator_new__(uVar28);
          if (uVar33 != 0) {
            uVar25 = 0;
            uVar30 = 0;
            do {
              frameRaw._rows[uVar30] = frameRaw._pixels + uVar25;
              uVar30 = uVar30 + 1;
              uVar25 = uVar25 + ((uint)CONCAT11(bVar3,bVar4) + iVar29 + iVar14) * 4;
            } while ((uVar24 | uVar16 | uVar11 | uVar15) != uVar30);
          }
          frameCur._colorType = '\x06';
          frameCur._width = uVar22;
          frameCur._height = uVar33;
          frameCur._pixels = (uchar *)operator_new__(uVar23);
          frameCur._rows = (uchar **)operator_new__(uVar28);
          if (uVar33 != 0) {
            local_d40 = (uint)bVar4;
            uVar30 = 0;
            uVar31 = 0;
            do {
              frameCur._rows[uVar31] = frameCur._pixels + uVar30;
              uVar31 = uVar31 + 1;
              uVar30 = (ulong)((int)uVar30 + (iVar14 + iVar29 + uVar26 + local_d40) * 4);
            } while ((uVar11 | uVar15 | uVar24 | uVar16) != uVar31);
          }
          bop = '\0';
          processing_start(this,&frameRaw,false);
          pAVar32 = __stream;
          iVar17 = feof((FILE *)__stream);
          bVar34 = false;
          if (iVar17 == 0) {
            local_d40 = (uint)bVar4;
            uVar25 = (iVar14 + iVar29 + uVar26 + local_d40) * 4;
            bVar13 = false;
            bVar34 = false;
            bVar12 = false;
            uVar21 = '\0';
            local_d44 = 0;
            uVar26 = 0;
            local_d00 = delayDen;
            local_cfc = delayNum;
            do {
LAB_00137b33:
              uVar18 = read_chunk(pAVar32,(FILE *)__stream,&chunk);
              uVar35 = (uint)local_d38;
              if ((int)uVar18 < 0x4c546366) {
                if ((uVar18 != 0x4c546361) || ((bool)(bVar13 | bVar12))) {
LAB_00137bb1:
                  if (uVar18 == 0x444e4549) {
                    if ((bVar13) && (pAVar32 = this, iVar14 = processing_finish(this), iVar14 == 0))
                    {
                      compose_frame(pAVar32,frameCur._rows,frameRaw._rows,bop,uVar26,local_d44,
                                    uVar22,uVar35);
                      frameCur._delayNum = local_cfc;
                      frameCur._delayDen = local_d00;
                      iVar10._M_current =
                           (this->_frames).
                           super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                      if (iVar10._M_current ==
                          (this->_frames).
                          super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                        std::vector<apngasm::APNGFrame,std::allocator<apngasm::APNGFrame>>::
                        _M_realloc_insert<apngasm::APNGFrame_const&>
                                  ((vector<apngasm::APNGFrame,std::allocator<apngasm::APNGFrame>> *)
                                   this,iVar10,&frameCur);
                      }
                      else {
                        memcpy(iVar10._M_current,&frameCur,0x430);
                        ppAVar1 = &(this->_frames).
                                   super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                        *ppAVar1 = *ppAVar1 + 1;
                      }
                    }
                    else {
LAB_001380b4:
                      if (frameCur._rows != (uchar **)0x0) {
                        operator_delete__(frameCur._rows);
                      }
                      if (frameCur._pixels != (uchar *)0x0) {
                        operator_delete__(frameCur._pixels);
                      }
                    }
LAB_001380dd:
                    if (chunk.p != (uchar *)0x0) {
                      operator_delete__(chunk.p);
                    }
                    break;
                  }
LAB_00137bc8:
                  if ((((((byte)(chunk.p[4] + 0x85) < 0xc6) || ((byte)(chunk.p[4] + 0xa5) < 6)) ||
                       ((byte)(chunk.p[5] + 0x85) < 0xc6)) ||
                      (((byte)(chunk.p[5] + 0xa5) < 6 || ((byte)(chunk.p[6] + 0x85) < 0xc6)))) ||
                     (((byte)(chunk.p[6] + 0xa5) < 6 ||
                      (((byte)(chunk.p[7] + 0x85) < 0xc6 || ((byte)(chunk.p[7] + 0xa5) < 6))))))
                  goto LAB_001380dd;
                  if (!bVar13) goto code_r0x00137c3b;
                }
                else {
                  uVar18 = *(uint *)(chunk.p + 0xc);
                  this->_loops = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8
                                 | uVar18 << 0x18;
                  bVar12 = true;
                  bVar34 = true;
                }
              }
              else if (uVar18 == 0x4c546366) {
                if (!bVar13) goto LAB_00137ecd;
                if (bVar12) {
                  iVar14 = processing_finish(this);
                  if (iVar14 != 0) goto LAB_001380b4;
                  frameNext._pixels = (uchar *)operator_new__(uVar23);
                  frameNext._rows = (uchar **)operator_new__(uVar28);
                  if (uVar33 != 0) {
                    uVar18 = 0;
                    uVar30 = 0;
                    do {
                      frameNext._rows[uVar30] = frameNext._pixels + uVar18;
                      uVar30 = uVar30 + 1;
                      uVar18 = uVar18 + uVar25;
                    } while (uVar11 + uVar15 + uVar24 + uVar16 != uVar30);
                  }
                  pAVar32 = (APNGAsm *)(ulong)uVar25;
                  if (uVar21 == '\x02') {
                    pAVar32 = (APNGAsm *)frameNext._pixels;
                    memcpy(frameNext._pixels,frameCur._pixels,uVar23);
                  }
                  compose_frame(pAVar32,frameCur._rows,frameRaw._rows,bop,uVar26,local_d44,uVar22,
                                uVar35);
                  frameCur._delayNum = local_cfc;
                  frameCur._delayDen = local_d00;
                  iVar10._M_current =
                       (this->_frames).
                       super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
                  if (iVar10._M_current ==
                      (this->_frames).
                      super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<apngasm::APNGFrame,std::allocator<apngasm::APNGFrame>>::
                    _M_realloc_insert<apngasm::APNGFrame_const&>
                              ((vector<apngasm::APNGFrame,std::allocator<apngasm::APNGFrame>> *)this
                               ,iVar10,&frameCur);
                  }
                  else {
                    memcpy(iVar10._M_current,&frameCur,0x430);
                    ppAVar1 = &(this->_frames).
                               super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                               ._M_impl.super__Vector_impl_data._M_finish;
                    *ppAVar1 = *ppAVar1 + 1;
                  }
                  if (((uVar21 != '\x02') &&
                      (memcpy(frameNext._pixels,frameCur._pixels,uVar23), uVar21 == '\x01')) &&
                     (uVar35 != 0)) {
                    do {
                      memset(frameNext._rows[local_d44] + (uVar26 << 2),0,(ulong)(uVar22 << 2));
                      local_d44 = local_d44 + 1;
                      local_d38 = local_d38 - 1;
                    } while (local_d38 != 0);
                  }
                  frameCur._pixels = frameNext._pixels;
                  frameCur._rows = frameNext._rows;
LAB_00137ecd:
                  uVar22 = *(uint *)(chunk.p + 0xc);
                  uVar26 = *(uint *)(chunk.p + 0x10);
                  uVar18 = *(uint *)(chunk.p + 0x14);
                  uVar35 = *(uint *)(chunk.p + 0x18);
                  uVar5 = *(ushort *)(chunk.p + 0x1c);
                  uVar6 = *(ushort *)(chunk.p + 0x1e);
                  uVar21 = chunk.p[0x20];
                  bop = chunk.p[0x21];
                  if (bVar13) {
                    *(undefined8 *)((this->_chunkIHDR).p + 8) = *(undefined8 *)(chunk.p + 0xc);
                    processing_start(this,&frameRaw,true);
                  }
                  else {
                    bVar34 = false;
                  }
                  uVar22 = uVar22 >> 0x18 | (uVar22 & 0xff0000) >> 8 | (uVar22 & 0xff00) << 8 |
                           uVar22 << 0x18;
                  local_d38 = (ulong)(uVar26 >> 0x18 | (uVar26 & 0xff0000) >> 8 |
                                      (uVar26 & 0xff00) << 8 | uVar26 << 0x18);
                  uVar26 = uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 | (uVar18 & 0xff00) << 8 |
                           uVar18 << 0x18;
                  local_d44 = uVar35 >> 0x18 | (uVar35 & 0xff0000) >> 8 | (uVar35 & 0xff00) << 8 |
                              uVar35 << 0x18;
                  local_cfc = (uint)(ushort)(uVar5 << 8 | uVar5 >> 8);
                  local_d00 = (uint)(ushort)(uVar6 << 8 | uVar6 >> 8);
                  if (((long)(this->_frames).
                             super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->_frames).
                             super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4) * -0xf4898d5f85bb395 -
                      (ulong)bVar34 == 0) {
                    if (uVar21 == '\x02') {
                      uVar21 = '\x01';
                    }
                    bop = '\0';
                  }
                }
                else {
LAB_00137bbd:
                  if (uVar18 != 0x54414449) goto LAB_00137bc8;
                  processing_data(this,chunk.p,chunk.size);
                  bVar13 = true;
                }
              }
              else {
                if (uVar18 != 0x54416466) goto LAB_00137bbd;
                if (!bVar12) goto LAB_00137bb1;
                png_save_uint_32(chunk.p + 4,chunk.size - 0x10);
                builtin_memcpy(chunk.p + 8,"IDAT",4);
                processing_data(this,chunk.p + 4,chunk.size - 4);
              }
              if (chunk.p != (uchar *)0x0) {
                operator_delete__(chunk.p);
              }
              pAVar32 = __stream;
              iVar14 = feof((FILE *)__stream);
              if (iVar14 != 0) break;
            } while( true );
          }
LAB_001380ea:
          if (frameRaw._rows != (uchar **)0x0) {
            operator_delete__(frameRaw._rows);
          }
          if (frameRaw._pixels != (uchar *)0x0) {
            operator_delete__(frameRaw._pixels);
          }
        }
      }
    }
    else {
      bVar34 = false;
    }
    fclose((FILE *)__stream);
    if (1 < (ulong)(((long)(this->_frames).
                           super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->_frames).
                           super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4) * -0xf4898d5f85bb395 -
                   (long)((int)((long)pAVar7 - (long)pAVar8 >> 4) * 0x7a44c6b))) {
      this->_skipFirst = bVar34;
    }
    pCVar20 = (this->_info_chunks).
              super__Vector_base<apngasm::CHUNK,_std::allocator<apngasm::CHUNK>_>._M_impl.
              super__Vector_impl_data._M_start;
    pCVar27 = (this->_info_chunks).
              super__Vector_base<apngasm::CHUNK,_std::allocator<apngasm::CHUNK>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (pCVar27 != pCVar20) {
      uVar23 = 0;
      uVar28 = 1;
      do {
        if (pCVar20[uVar23].p != (uchar *)0x0) {
          operator_delete__(pCVar20[uVar23].p);
        }
        pCVar20 = (this->_info_chunks).
                  super__Vector_base<apngasm::CHUNK,_std::allocator<apngasm::CHUNK>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pCVar27 = (this->_info_chunks).
                  super__Vector_base<apngasm::CHUNK,_std::allocator<apngasm::CHUNK>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        bVar34 = uVar28 < (ulong)((long)pCVar27 - (long)pCVar20 >> 4);
        uVar23 = uVar28;
        uVar28 = (ulong)((int)uVar28 + 1);
      } while (bVar34);
    }
    if (pCVar27 != pCVar20) {
      (this->_info_chunks).super__Vector_base<apngasm::CHUNK,_std::allocator<apngasm::CHUNK>_>.
      _M_impl.super__Vector_impl_data._M_finish = pCVar20;
    }
    puVar9 = (this->_chunkIHDR).p;
    if (puVar9 != (uchar *)0x0) {
      operator_delete__(puVar9);
    }
  }
  return &this->_frames;
code_r0x00137c3b:
  processing_data(this,chunk.p,chunk.size);
  __position._M_current =
       (this->_info_chunks).super__Vector_base<apngasm::CHUNK,_std::allocator<apngasm::CHUNK>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->_info_chunks).super__Vector_base<apngasm::CHUNK,_std::allocator<apngasm::CHUNK>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<apngasm::CHUNK,std::allocator<apngasm::CHUNK>>::
    _M_realloc_insert<apngasm::CHUNK_const&>
              ((vector<apngasm::CHUNK,std::allocator<apngasm::CHUNK>> *)&this->_info_chunks,
               __position,&chunk);
  }
  else {
    *(ulong *)__position._M_current = CONCAT44(chunk._4_4_,chunk.size);
    (__position._M_current)->p = chunk.p;
    ppCVar2 = &(this->_info_chunks).
               super__Vector_base<apngasm::CHUNK,_std::allocator<apngasm::CHUNK>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppCVar2 = *ppCVar2 + 1;
  }
  pAVar32 = __stream;
  iVar14 = feof((FILE *)__stream);
  if (iVar14 != 0) goto LAB_001380ea;
  goto LAB_00137b33;
}

Assistant:

const std::vector<APNGFrame>& APNGAsm::fileToFrames(const std::string &filePath, unsigned int delayNum, unsigned int delayDen)
  {
    const int oldFrameCount = _frames.size();
    unsigned int   i, j, id;
    unsigned int   w, h;
    CHUNK chunk;

    FILE * f;
    if ((f = fopen(filePath.c_str(), "rb")) != 0)
    {
      unsigned char sig[8];
      unsigned int  w0, h0, x0, y0;
      unsigned int  delay_num, delay_den, dop, bop, rowbytes, imagesize;
      bool          isAnimated = false;
      bool          skipFirst = false;
      bool          hasInfo = false;

      if (fread(sig, 1, 8, f) == 8 && png_sig_cmp(sig, 0, 8) == 0)
      {
        id = read_chunk(f, &_chunkIHDR);

        if (id == id_IHDR && _chunkIHDR.size == 25)
        {
          w0 = w = png_get_uint_32(_chunkIHDR.p + 8);
          h0 = h = png_get_uint_32(_chunkIHDR.p + 12);
          x0 = 0;
          y0 = 0;
          delay_num = delayNum;
          delay_den = delayDen;
          dop = 0;
          bop = 0;
          rowbytes = w * 4;
          imagesize = h * rowbytes;

          APNGFrame frameRaw;
          APNGFrame frameCur;
          APNGFrame frameNext;

          frameRaw._pixels = new unsigned char[imagesize];
          frameRaw._rows = new png_bytep[h * sizeof(png_bytep)];
          for (j=0; j<h; ++j)
            frameRaw._rows[j] = frameRaw._pixels + j * rowbytes;

          frameCur._width = w;
          frameCur._height = h;
          frameCur._colorType = 6;
          frameCur._pixels = new unsigned char[imagesize];
          frameCur._rows = new png_bytep[h * sizeof(png_bytep)];
          for (j=0; j<h; ++j)
            frameCur._rows[j] = frameCur._pixels + j * rowbytes;

          processing_start((void *)&frameRaw, hasInfo);

          while ( !feof(f) )
          {
            id = read_chunk(f, &chunk);

            if (id == id_acTL && !hasInfo && !isAnimated)
            {
              isAnimated = true;
              skipFirst = true;
              _loops = png_get_uint_32(chunk.p + 12);
            }
            else
            if (id == id_fcTL && (!hasInfo || isAnimated))
            {
              if (hasInfo)
              {
                if (!processing_finish())
                {
                  frameNext._pixels = new unsigned char[imagesize];
                  frameNext._rows = new png_bytep[h * sizeof(png_bytep)];
                  for (j=0; j<h; ++j)
                    frameNext._rows[j] = frameNext._pixels + j * rowbytes;

                  if (dop == 2)
                    memcpy(frameNext._pixels, frameCur._pixels, imagesize);

                  compose_frame(frameCur._rows, frameRaw._rows, bop, x0, y0, w0, h0);
                  frameCur._delayNum = delay_num;
                  frameCur._delayDen = delay_den;
                  _frames.push_back(frameCur);

                  if (dop != 2)
                  {
                    memcpy(frameNext._pixels, frameCur._pixels, imagesize);
                    if (dop == 1)
                      for (j=0; j<h0; j++)
                        memset(frameNext._rows[y0 + j] + x0*4, 0, w0*4);
                  }
                  frameCur._pixels = frameNext._pixels;
                  frameCur._rows = frameNext._rows;
                }
                else
                {
                  delete[] frameCur._rows;
                  delete[] frameCur._pixels;
                  delete[] chunk.p;
                  break;
                }
              }

              // At this point the old frame is done. Let's start a new one.
              w0 = png_get_uint_32(chunk.p + 12);
              h0 = png_get_uint_32(chunk.p + 16);
              x0 = png_get_uint_32(chunk.p + 20);
              y0 = png_get_uint_32(chunk.p + 24);
              delay_num = png_get_uint_16(chunk.p + 28);
              delay_den = png_get_uint_16(chunk.p + 30);
              dop = chunk.p[32];
              bop = chunk.p[33];

              if (hasInfo)
              {
                memcpy(_chunkIHDR.p + 8, chunk.p + 12, 8);
                processing_start((void *)&frameRaw, hasInfo);
              }
              else
                skipFirst = false;

              if (_frames.size() == (skipFirst ? 1 : 0))
              {
                bop = 0;
                if (dop == 2)
                  dop = 1;
              }
            }
            else
            if (id == id_IDAT)
            {
              hasInfo = true;
              processing_data(chunk.p, chunk.size);
            }
            else
            if (id == id_fdAT && isAnimated)
            {
              png_save_uint_32(chunk.p + 4, chunk.size - 16);
              memcpy(chunk.p + 8, "IDAT", 4);
              processing_data(chunk.p + 4, chunk.size - 4);
            }
            else
            if (id == id_IEND)
            {
              if (hasInfo && !processing_finish())
              {
                compose_frame(frameCur._rows, frameRaw._rows, bop, x0, y0, w0, h0);
                frameCur._delayNum = delay_num;
                frameCur._delayDen = delay_den;
                _frames.push_back(frameCur);
              }
              else
              {
                delete[] frameCur._rows;
                delete[] frameCur._pixels;
              }
              delete[] chunk.p;
              break;
            }
            else
            if (notabc(chunk.p[4]) || notabc(chunk.p[5]) || notabc(chunk.p[6]) || notabc(chunk.p[7]))
            {
              delete[] chunk.p;
              break;
            }
            else
            if (!hasInfo)
            {
              processing_data(chunk.p, chunk.size);
              _info_chunks.push_back(chunk);
              continue;
            }
            delete[] chunk.p;
          }
          delete[] frameRaw._rows;
          delete[] frameRaw._pixels;
        }
      }
      fclose(f);

      if(_frames.size() - oldFrameCount > 1)
        setSkipFirst(skipFirst);

      for (i=0; i<_info_chunks.size(); ++i)
        delete[] _info_chunks[i].p;

      _info_chunks.clear();

      delete[] _chunkIHDR.p;
    }
    return _frames;
  }